

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Bytes __thiscall Omega_h::each_eq_to<double>(Omega_h *this,Read<double> *a,double b)

{
  int *piVar1;
  Alloc *pAVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar3;
  LO n;
  size_t sVar4;
  Bytes BVar5;
  Write<signed_char> c;
  type_conflict2 f;
  Write<signed_char> local_78;
  type_conflict2 local_60;
  Write<signed_char> local_38;
  double local_28;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar4 = pAVar2->size;
  }
  else {
    sVar4 = (ulong)pAVar2 >> 3;
  }
  local_60.c.shared_alloc_.alloc = (Alloc *)&local_60.a;
  local_28 = b;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  Write<signed_char>::Write(&local_78,(LO)(sVar4 >> 3),(string *)&local_60);
  if (local_60.c.shared_alloc_.alloc != (Alloc *)&local_60.a) {
    operator_delete(local_60.c.shared_alloc_.alloc,
                    (ulong)((long)&(local_60.a.write_.shared_alloc_.alloc)->size + 1));
  }
  local_60.c.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_60.c.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_60.c.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
  local_60.a.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_60.a.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.a.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.a.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.a.write_.shared_alloc_.alloc)->use_count =
           (local_60.a.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_60.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  local_60.b = local_28;
  if (((ulong)local_78.shared_alloc_.alloc & 1) == 0) {
    n = (LO)(local_78.shared_alloc_.alloc)->size;
  }
  else {
    n = (LO)((ulong)local_78.shared_alloc_.alloc >> 3);
  }
  parallel_for<Omega_h::each_eq_to<double>(Omega_h::Read<double>,double)::_lambda(int)_1_>
            (n,&local_60,"each_eq_to");
  local_38.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
  local_38.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
  if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
       local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
    local_38.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_78.shared_alloc_.alloc = (Alloc *)0x0;
  local_78.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_38);
  pAVar2 = local_38.shared_alloc_.alloc;
  pvVar3 = extraout_RDX;
  if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 && local_38.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  pAVar2 = local_60.a.write_.shared_alloc_.alloc;
  if (((ulong)local_60.a.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.a.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.a.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_01;
    }
  }
  pAVar2 = local_60.c.shared_alloc_.alloc;
  if (((ulong)local_60.c.shared_alloc_.alloc & 7) == 0 &&
      local_60.c.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.c.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.c.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_02;
    }
  }
  pAVar2 = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_03;
    }
  }
  BVar5.write_.shared_alloc_.direct_ptr = pvVar3;
  BVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar5.write_.shared_alloc_;
}

Assistant:

Bytes each_eq_to(Read<T> a, T b) {
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] == b); };
  parallel_for(c.size(), f, "each_eq_to");
  return c;
}